

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void * curve_new(t_symbol *classsym,int argc,t_atom *argv)

{
  char *pcVar1;
  int iVar2;
  t_pd *object;
  _glist *p_Var3;
  t_pd p_Var4;
  bool bVar5;
  char *flag;
  _fielddesc *fd;
  int i;
  int nxy;
  int flags;
  char *classname;
  t_curve *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *classsym_local;
  
  object = pd_new(curve_class);
  pcVar1 = classsym->s_name;
  p_Var3 = canvas_getcurrent();
  object[0x1d] = (t_pd)p_Var3;
  if (*pcVar1 != 'f') {
    _nxy = pcVar1 + 4;
  }
  else {
    _nxy = pcVar1 + 6;
  }
  i = (int)(*pcVar1 == 'f');
  if (*_nxy == 'c') {
    i = i | 2;
  }
  fielddesc_setfloat_const((_fielddesc *)(object + 0x16),1.0);
  x = (t_curve *)argv;
  argv_local._4_4_ = argc;
  while( true ) {
    bVar5 = false;
    if ((argv_local._4_4_ != 0) && (bVar5 = false, *(int *)&(x->x_obj).te_g.g_pd == 2)) {
      bVar5 = *(char *)&((x->x_obj).te_g.g_next)->g_pd->c_name == '-';
    }
    if (!bVar5) break;
    p_Var4 = ((x->x_obj).te_g.g_next)->g_pd;
    iVar2 = strcmp((char *)p_Var4,"-n");
    if (iVar2 == 0) {
      fielddesc_setfloat_const((_fielddesc *)(object + 0x16),0.0);
    }
    else {
      iVar2 = strcmp((char *)p_Var4,"-v");
      if ((iVar2 == 0) && (1 < (int)argv_local._4_4_)) {
        fielddesc_setfloatarg((_fielddesc *)(object + 0x16),1,(t_atom *)&(x->x_obj).te_binbuf);
        argv_local._4_4_ = argv_local._4_4_ - 1;
        x = (t_curve *)&(x->x_obj).te_binbuf;
      }
      else {
        iVar2 = strcmp((char *)p_Var4,"-x");
        if (iVar2 == 0) {
          i = i | 0xc;
        }
        else {
          iVar2 = strcmp((char *)p_Var4,"-xr");
          if (iVar2 == 0) {
            i = i | 4;
          }
          else {
            iVar2 = strcmp((char *)p_Var4,"-xe");
            if (iVar2 == 0) {
              i = i | 8;
            }
            else {
              iVar2 = strcmp((char *)p_Var4,"-xv");
              if (iVar2 == 0) {
                i = i | 0x10;
              }
              else {
                pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,p_Var4);
              }
            }
          }
        }
      }
    }
    argv_local._4_4_ = argv_local._4_4_ - 1;
    x = (t_curve *)&(x->x_obj).te_binbuf;
  }
  *(int *)(object + 6) = i;
  if (((i & 1U) == 0) || (argv_local._4_4_ == 0)) {
    fielddesc_setfloat_const((_fielddesc *)(object + 7),0.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 7),argv_local._4_4_,(t_atom *)x);
    x = (t_curve *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ - 1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0xc),0.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argv_local._4_4_,(t_atom *)x);
    x = (t_curve *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ - 1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0x11),1.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0x11),argv_local._4_4_,(t_atom *)x);
    x = (t_curve *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ - 1;
  }
  if ((int)argv_local._4_4_ < 0) {
    argv_local._4_4_ = 0;
  }
  iVar2 = argv_local._4_4_ + (argv_local._4_4_ & 1);
  *(int *)(object + 0x1b) = iVar2 >> 1;
  p_Var4 = (t_pd)getbytes((long)iVar2 * 0x28);
  object[0x1c] = p_Var4;
  fd._4_4_ = 0;
  flag = (char *)object[0x1c];
  for (; fd._4_4_ < (int)argv_local._4_4_; fd._4_4_ = fd._4_4_ + 1) {
    fielddesc_setfloatarg((_fielddesc *)flag,1,(t_atom *)x);
    flag = flag + 0x28;
    x = (t_curve *)&(x->x_obj).te_binbuf;
  }
  if ((argv_local._4_4_ & 1) != 0) {
    fielddesc_setfloat_const((_fielddesc *)flag,0.0);
  }
  return object;
}

Assistant:

static void *curve_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_curve *x = (t_curve *)pd_new(curve_class);
    const char *classname = classsym->s_name;
    int flags = 0;
    int nxy, i;
    t_fielddesc *fd;
    x->x_canvas = canvas_getcurrent();
    if (classname[0] == 'f')
    {
        classname += 6;
        flags |= CLOSED;
    }
    else classname += 4;
    if (classname[0] == 'c') flags |= BEZ;
    fielddesc_setfloat_const(&x->x_vis, 1);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name;
        if (!strcmp(flag, "-n"))
        {
            fielddesc_setfloat_const(&x->x_vis, 0);
        }
        else if (!strcmp(flag, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "-x"))
        {
            /* disable all mouse interaction */
            flags |= (NOMOUSERUN | NOMOUSEEDIT);
        }
        else if (!strcmp(flag, "-xr"))
        {
            /* disable mouse actions in run mode */
            flags |= NOMOUSERUN;
        }
        else if (!strcmp(flag, "-xe"))
        {
            /* disable mouse actions in edit mode */
            flags |= NOMOUSEEDIT;
        }
        else if (!strcmp(flag, "-xv"))
        {
            /* disable changing vertices in run mode */
            flags |= NOVERTICES;
        }
        else
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                flag);
        }
        argc--; argv++;
    }
    x->x_flags = flags;
    if ((flags & CLOSED) && argc)
        fielddesc_setfloatarg(&x->x_fillcolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_fillcolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc < 0) argc = 0;
    nxy =  (argc + (argc & 1));
    x->x_npoints = (nxy>>1);
    x->x_vec = (t_fielddesc *)t_getbytes(nxy * sizeof(t_fielddesc));
    for (i = 0, fd = x->x_vec; i < argc; i++, fd++, argv++)
        fielddesc_setfloatarg(fd, 1, argv);
    if (argc & 1) fielddesc_setfloat_const(fd, 0);

    return (x);
}